

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_random.h
# Opt level: O0

int __thiscall FastRandom::next(FastRandom *this,int min,int max)

{
  ulong uVar1;
  unsigned_long t;
  int max_local;
  int min_local;
  FastRandom *this_local;
  
  this->x = this->x << 0x10 ^ this->x;
  this->x = this->x >> 5 ^ this->x;
  this->x = this->x << 1 ^ this->x;
  uVar1 = this->x;
  this->x = this->y;
  this->y = this->z;
  this->z = uVar1 ^ this->x ^ this->y;
  return min + (int)(this->z % (((long)max - (long)min) + 1U));
}

Assistant:

int next(int min=0, int max=std::numeric_limits<int>::max()) {
        x ^= x << 16;
        x ^= x >> 5;
        x ^= x << 1;

        unsigned long t = x;
        x = y;
        y = z;
        z = t ^ x ^ y;

        return min + (unsigned int) (z % (((unsigned long) max) - min + 1));
    }